

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O0

BGwCI_sharedPtr
BayesianGameWithClusterInfo::ConstructExtendedBGWCI
          (BGwCI_constPtr *pBG,JointPolicyDiscretePure *prevJPolBG,QFunctionJAOHInterface *q)

{
  Index IVar1;
  int iVar2;
  int iVar3;
  BGClusterAlgorithm BVar4;
  type pBVar5;
  ulong uVar6;
  undefined4 extraout_var;
  BayesianGameWithClusterInfo *this;
  PlanningUnitDecPOMDPDiscrete *pu;
  PlanningUnitDecPOMDPDiscrete *q_00;
  undefined4 extraout_var_00;
  double in_RCX;
  long *in_RDX;
  shared_count extraout_RDX;
  shared_ptr<const_BayesianGameWithClusterInfo> *in_RSI;
  element_type *in_RDI;
  BGwCI_sharedPtr BVar7;
  shared_ptr<JointPolicyDiscretePure> prevJPolBGptr;
  Index agI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrTypes;
  Index t;
  BGwCI_sharedPtr *bg;
  BayesianGameWithClusterInfo *in_stack_000002b0;
  size_type in_stack_fffffffffffffe78;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe94;
  BayesianGameWithClusterInfo *in_stack_fffffffffffffe98;
  shared_ptr<BayesianGameWithClusterInfo> *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffef8;
  shared_ptr<const_BayesianGameWithClusterInfo> *prevBG;
  reference in_stack_ffffffffffffff30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff38;
  PlanningUnitDecPOMDPDiscrete *in_stack_ffffffffffffff40;
  BGClusterAlgorithm clusterAlg;
  type in_stack_ffffffffffffff48;
  shared_ptr<const_JointPolicyDiscretePure> local_80;
  undefined1 local_69;
  undefined1 local_68 [36];
  uint local_44;
  int local_24;
  double local_20;
  long *local_18;
  shared_ptr<const_BayesianGameWithClusterInfo> *local_10;
  double thresholdPjaoh;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pBVar5 = boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(in_RSI);
  IVar1 = BayesianGameForDecPOMDPStageInterface::GetStage
                    ((BayesianGameForDecPOMDPStageInterface *)pBVar5);
  local_24 = IVar1 + 1;
  pBVar5 = boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(local_10);
  BayesianGameBase::GetNrTypes
            ((BayesianGameBase *)
             &(pBVar5->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffed0,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  local_44 = 0;
  while( true ) {
    clusterAlg = (BGClusterAlgorithm)in_stack_ffffffffffffff48;
    uVar6 = (ulong)local_44;
    pBVar5 = boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(local_10);
    iVar2 = (*(pBVar5->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
              super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[3])
                      (&(pBVar5->super_BayesianGameForDecPOMDPStage).
                        super_BayesianGameIdenticalPayoff);
    if (CONCAT44(extraout_var,iVar2) <= uVar6) break;
    in_stack_ffffffffffffff48 =
         boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(local_10);
    in_stack_ffffffffffffff40 =
         BayesianGameForDecPOMDPStage::GetPUDecPOMDPDiscrete
                   (&in_stack_ffffffffffffff48->super_BayesianGameForDecPOMDPStage);
    in_stack_ffffffffffffff38 =
         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
         PlanningUnitMADPDiscrete::GetNrObservations
                   (in_stack_fffffffffffffe80,(Index)(in_stack_fffffffffffffe78 >> 0x20));
    in_stack_ffffffffffffff30 =
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    *in_stack_ffffffffffffff30 = (long)in_stack_ffffffffffffff38 * *in_stack_ffffffffffffff30;
    local_44 = local_44 + 1;
  }
  (**(code **)(*local_18 + 0x28))();
  boost::shared_ptr<JointPolicyDiscretePure>::shared_ptr<JointPolicyDiscretePure>
            ((shared_ptr<JointPolicyDiscretePure> *)in_stack_fffffffffffffea0,
             (JointPolicyDiscretePure *)in_stack_fffffffffffffe98);
  local_69 = 0;
  this = (BayesianGameWithClusterInfo *)operator_new(0x1c8);
  pu = (PlanningUnitDecPOMDPDiscrete *)
       boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(local_10);
  q_00 = BayesianGameForDecPOMDPStage::GetPUDecPOMDPDiscrete((BayesianGameForDecPOMDPStage *)pu);
  iVar2 = local_24;
  prevBG = local_10;
  boost::shared_ptr<const_JointPolicyDiscretePure>::shared_ptr<JointPolicyDiscretePure>
            (&local_80,local_68);
  pBVar5 = boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(local_10);
  iVar3 = (*(pBVar5->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
            super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[3])
                    (&(pBVar5->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff
                    );
  IVar1 = (Index)((ulong)pBVar5 >> 0x20);
  thresholdPjaoh = (double)CONCAT44(extraout_var_00,iVar3);
  pBVar5 = boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(local_10);
  BayesianGameBase::GetNrActions
            ((BayesianGameBase *)
             &(pBVar5->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff);
  pBVar5 = boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(local_10);
  BVar4 = GetClusterAlgorithm(pBVar5);
  pBVar5 = boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(local_10);
  GetThresholdJB(pBVar5);
  pBVar5 = boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(local_10);
  GetThresholdPjaoh(pBVar5);
  BayesianGameWithClusterInfo
            (this,pu,(QFunctionJAOHInterface *)q_00,IVar1,prevBG,
             (shared_ptr<const_JointPolicyDiscretePure> *)CONCAT44(iVar2,in_stack_fffffffffffffef8),
             (size_t)in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff40,
             clusterAlg,local_20,thresholdPjaoh);
  boost::shared_ptr<BayesianGameWithClusterInfo>::shared_ptr<BayesianGameWithClusterInfo>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  boost::shared_ptr<const_JointPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<const_JointPolicyDiscretePure> *)0x8bc5a9);
  boost::shared_ptr<BayesianGameWithClusterInfo>::operator->
            ((shared_ptr<BayesianGameWithClusterInfo> *)in_RDI);
  Extend(in_stack_000002b0);
  local_69 = 1;
  boost::shared_ptr<JointPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<JointPolicyDiscretePure> *)0x8bc691);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffe94,BVar4));
  BVar7.pn.pi_ = extraout_RDX.pi_;
  BVar7.px = in_RDI;
  return BVar7;
}

Assistant:

BGwCI_sharedPtr 
BayesianGameWithClusterInfo::ConstructExtendedBGWCI(
        const BGwCI_constPtr &pBG,
        const JointPolicyDiscretePure& prevJPolBG,
        //const JointPolicyPureVector& prevJPolBG,
        const QFunctionJAOHInterface* q
 )
{
    //compute extended individual histories for each agent
    Index t = pBG->GetStage()+1;
    vector<size_t> nrTypes = pBG->GetNrTypes();   
    //each agent will form newtype = <type, action, observation>
    //tuples. Since the action is fixed (by prevJPolBG), the number of new
    //types for agent i is: nrTypes_i * nrObservations_i
    for(Index agI=0; agI < pBG->GetNrAgents(); agI++)
        nrTypes.at(agI) *= pBG->GetPUDecPOMDPDiscrete()->GetNrObservations(agI);

    boost::shared_ptr<JointPolicyDiscretePure> prevJPolBGptr=
        boost::shared_ptr<JointPolicyDiscretePure>(prevJPolBG.Clone());
    BGwCI_sharedPtr bg(new BayesianGameWithClusterInfo(
                           pBG->GetPUDecPOMDPDiscrete(), q, t,
                           pBG,
                           prevJPolBGptr, 
                           pBG->GetNrAgents(),
                           pBG->GetNrActions(),
                           nrTypes,
                           pBG->GetClusterAlgorithm(),
                           pBG->GetThresholdJB(),
                           pBG->GetThresholdPjaoh()
                           ));

    bg->Extend();
    //return the newly constructed bg
    return(bg);
}